

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_3x3_pack16.h
# Opt level: O0

void ncnn::pooling3x3s2_max_pack16_avx512(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  long lVar10;
  long lVar11;
  int iVar12;
  long *in_RSI;
  long *in_RDI;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  __m512 _max1;
  __m512 _max0;
  __m512 _r22_2;
  __m512 _r21_2;
  __m512 _r20_2;
  __m512 _r12_2;
  __m512 _r11_2;
  __m512 _r10_2;
  __m512 _r02_2;
  __m512 _r01_2;
  __m512 _r00_2;
  __m512 _max11_1;
  __m512 _max10_1;
  __m512 _r24_1;
  __m512 _r23_1;
  __m512 _r14_1;
  __m512 _r13_1;
  __m512 _r04_1;
  __m512 _r03_1;
  __m512 _max01_1;
  __m512 _max00_1;
  __m512 _r22_1;
  __m512 _r21_1;
  __m512 _r20_1;
  __m512 _r12_1;
  __m512 _r11_1;
  __m512 _r10_1;
  __m512 _r02_1;
  __m512 _r01_1;
  __m512 _r00_1;
  __m512 _max31;
  __m512 _max30;
  __m512 _r28;
  __m512 _r27;
  __m512 _r18;
  __m512 _r17;
  __m512 _r08;
  __m512 _r07;
  __m512 _max21;
  __m512 _max20;
  __m512 _r26;
  __m512 _r25;
  __m512 _r16;
  __m512 _r15;
  __m512 _r06;
  __m512 _r05;
  __m512 _max11;
  __m512 _max10;
  __m512 _r24;
  __m512 _r23;
  __m512 _r14;
  __m512 _r13;
  __m512 _r04;
  __m512 _r03;
  __m512 _max01;
  __m512 _max00;
  __m512 _r22;
  __m512 _r21;
  __m512 _r20;
  __m512 _r12;
  __m512 _r11;
  __m512 _r10;
  __m512 _r02;
  __m512 _r01;
  __m512 _r00;
  int j;
  int i;
  float *r2;
  float *r1;
  float *r0;
  float *outptr;
  Mat img0;
  int q;
  int tailstep;
  int outh;
  int outw;
  int inch;
  int w;
  Mat *m;
  Mat *m_1;
  int local_2450;
  int local_244c;
  undefined1 (*local_2448) [64];
  undefined1 (*local_2440) [64];
  undefined1 (*local_2438) [64];
  undefined8 *local_23d8;
  int local_2388;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  
  lVar10 = in_RDI[7];
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar11 = in_RSI[6];
  iVar12 = (*(int *)((long)in_RDI + 0x2c) * 2 + iVar1 * -2) * 0x10;
  for (local_2388 = 0; local_2388 < (int)lVar10; local_2388 = local_2388 + 1) {
    local_2438 = (undefined1 (*) [64])(*in_RDI + in_RDI[8] * (long)local_2388 * in_RDI[2]);
    local_23d8 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_2388 * in_RSI[2]);
    local_2440 = (undefined1 (*) [64])
                 (*local_2438 + (long)*(int *)((long)in_RDI + 0x2c) * in_RDI[2]);
    local_2448 = (undefined1 (*) [64])
                 (*local_2438 + (long)*(int *)((long)in_RDI + 0x2c) * 2 * in_RDI[2]);
    for (local_244c = 0; local_244c < (int)lVar11; local_244c = local_244c + 1) {
      for (local_2450 = 0; local_2450 + 3 < iVar1; local_2450 = local_2450 + 4) {
        auVar2 = local_2438[2];
        auVar5 = local_2440[2];
        auVar8 = local_2448[2];
        auVar13 = vmaxps_avx512f(*local_2438,local_2438[1]);
        auVar13 = vmaxps_avx512f(auVar13,local_2438[2]);
        auVar13 = vmaxps_avx512f(auVar13,*local_2440);
        auVar14 = vmaxps_avx512f(auVar13,local_2440[1]);
        auVar13 = vmaxps_avx512f(local_2440[2],*local_2448);
        auVar13 = vmaxps_avx512f(auVar13,local_2448[1]);
        auVar15 = vmaxps_avx512f(auVar13,local_2448[2]);
        auVar13 = local_2438[3];
        auVar16 = local_2438[4];
        auVar18 = local_2438[4];
        auVar3 = local_2440[3];
        auVar17 = local_2440[4];
        auVar4 = local_2440[4];
        auVar6 = local_2448[3];
        auVar9 = local_2448[4];
        auVar7 = local_2448[4];
        auVar14 = vmaxps_avx512f(auVar14,auVar15);
        local_240 = auVar14._0_8_;
        uStack_238 = auVar14._8_8_;
        uStack_230 = auVar14._16_8_;
        uStack_228 = auVar14._24_8_;
        uStack_220 = auVar14._32_8_;
        uStack_218 = auVar14._40_8_;
        uStack_210 = auVar14._48_8_;
        uStack_208 = auVar14._56_8_;
        *local_23d8 = local_240;
        local_23d8[1] = uStack_238;
        local_23d8[2] = uStack_230;
        local_23d8[3] = uStack_228;
        local_23d8[4] = uStack_220;
        local_23d8[5] = uStack_218;
        local_23d8[6] = uStack_210;
        local_23d8[7] = uStack_208;
        auVar13 = vmaxps_avx512f(auVar13,auVar18);
        auVar13 = vmaxps_avx512f(auVar13,auVar2);
        auVar13 = vmaxps_avx512f(auVar13,auVar3);
        auVar13 = vmaxps_avx512f(auVar13,auVar4);
        auVar14 = vmaxps_avx512f(auVar5,auVar6);
        auVar13 = vmaxps_avx512f(auVar13,auVar7);
        auVar15 = vmaxps_avx512f(auVar13,auVar8);
        auVar13 = local_2438[5];
        auVar6 = local_2438[6];
        auVar18 = local_2438[6];
        auVar2 = local_2440[5];
        auVar7 = local_2440[6];
        auVar3 = local_2440[6];
        auVar4 = local_2448[5];
        auVar8 = local_2448[6];
        auVar5 = local_2448[6];
        auVar14 = vmaxps_avx512f(auVar15,auVar14);
        local_2c0 = auVar14._0_8_;
        uStack_2b8 = auVar14._8_8_;
        uStack_2b0 = auVar14._16_8_;
        uStack_2a8 = auVar14._24_8_;
        uStack_2a0 = auVar14._32_8_;
        uStack_298 = auVar14._40_8_;
        uStack_290 = auVar14._48_8_;
        uStack_288 = auVar14._56_8_;
        local_23d8[8] = local_2c0;
        local_23d8[9] = uStack_2b8;
        local_23d8[10] = uStack_2b0;
        local_23d8[0xb] = uStack_2a8;
        local_23d8[0xc] = uStack_2a0;
        local_23d8[0xd] = uStack_298;
        local_23d8[0xe] = uStack_290;
        local_23d8[0xf] = uStack_288;
        auVar13 = vmaxps_avx512f(auVar13,auVar18);
        auVar13 = vmaxps_avx512f(auVar13,auVar16);
        auVar13 = vmaxps_avx512f(auVar13,auVar2);
        auVar13 = vmaxps_avx512f(auVar13,auVar3);
        auVar16 = vmaxps_avx512f(auVar17,auVar4);
        auVar13 = vmaxps_avx512f(auVar13,auVar5);
        auVar17 = vmaxps_avx512f(auVar13,auVar9);
        auVar13 = local_2438[7];
        auVar18 = local_2438[8];
        auVar2 = local_2440[7];
        auVar3 = local_2440[8];
        auVar4 = local_2448[7];
        auVar5 = local_2448[8];
        auVar16 = vmaxps_avx512f(auVar17,auVar16);
        local_340 = auVar16._0_8_;
        uStack_338 = auVar16._8_8_;
        uStack_330 = auVar16._16_8_;
        uStack_328 = auVar16._24_8_;
        uStack_320 = auVar16._32_8_;
        uStack_318 = auVar16._40_8_;
        uStack_310 = auVar16._48_8_;
        uStack_308 = auVar16._56_8_;
        local_23d8[0x10] = local_340;
        local_23d8[0x11] = uStack_338;
        local_23d8[0x12] = uStack_330;
        local_23d8[0x13] = uStack_328;
        local_23d8[0x14] = uStack_320;
        local_23d8[0x15] = uStack_318;
        local_23d8[0x16] = uStack_310;
        local_23d8[0x17] = uStack_308;
        auVar13 = vmaxps_avx512f(auVar13,auVar18);
        auVar13 = vmaxps_avx512f(auVar13,auVar6);
        auVar13 = vmaxps_avx512f(auVar13,auVar2);
        auVar13 = vmaxps_avx512f(auVar13,auVar3);
        auVar18 = vmaxps_avx512f(auVar7,auVar4);
        auVar13 = vmaxps_avx512f(auVar13,auVar5);
        auVar13 = vmaxps_avx512f(auVar13,auVar8);
        auVar13 = vmaxps_avx512f(auVar13,auVar18);
        local_3c0 = auVar13._0_8_;
        uStack_3b8 = auVar13._8_8_;
        uStack_3b0 = auVar13._16_8_;
        uStack_3a8 = auVar13._24_8_;
        uStack_3a0 = auVar13._32_8_;
        uStack_398 = auVar13._40_8_;
        uStack_390 = auVar13._48_8_;
        uStack_388 = auVar13._56_8_;
        local_23d8[0x18] = local_3c0;
        local_23d8[0x19] = uStack_3b8;
        local_23d8[0x1a] = uStack_3b0;
        local_23d8[0x1b] = uStack_3a8;
        local_23d8[0x1c] = uStack_3a0;
        local_23d8[0x1d] = uStack_398;
        local_23d8[0x1e] = uStack_390;
        local_23d8[0x1f] = uStack_388;
        local_2438 = local_2438 + 8;
        local_2440 = local_2440 + 8;
        local_2448 = local_2448 + 8;
        local_23d8 = local_23d8 + 0x20;
      }
      for (; local_2450 + 1 < iVar1; local_2450 = local_2450 + 2) {
        auVar2 = local_2438[2];
        auVar5 = local_2440[2];
        auVar8 = local_2448[2];
        auVar13 = vmaxps_avx512f(*local_2438,local_2438[1]);
        auVar13 = vmaxps_avx512f(auVar13,local_2438[2]);
        auVar13 = vmaxps_avx512f(auVar13,*local_2440);
        auVar16 = vmaxps_avx512f(auVar13,local_2440[1]);
        auVar13 = vmaxps_avx512f(local_2440[2],*local_2448);
        auVar13 = vmaxps_avx512f(auVar13,local_2448[1]);
        auVar17 = vmaxps_avx512f(auVar13,local_2448[2]);
        auVar13 = local_2438[3];
        auVar18 = local_2438[4];
        auVar3 = local_2440[3];
        auVar4 = local_2440[4];
        auVar6 = local_2448[3];
        auVar7 = local_2448[4];
        auVar16 = vmaxps_avx512f(auVar16,auVar17);
        local_440 = auVar16._0_8_;
        uStack_438 = auVar16._8_8_;
        uStack_430 = auVar16._16_8_;
        uStack_428 = auVar16._24_8_;
        uStack_420 = auVar16._32_8_;
        uStack_418 = auVar16._40_8_;
        uStack_410 = auVar16._48_8_;
        uStack_408 = auVar16._56_8_;
        *local_23d8 = local_440;
        local_23d8[1] = uStack_438;
        local_23d8[2] = uStack_430;
        local_23d8[3] = uStack_428;
        local_23d8[4] = uStack_420;
        local_23d8[5] = uStack_418;
        local_23d8[6] = uStack_410;
        local_23d8[7] = uStack_408;
        auVar13 = vmaxps_avx512f(auVar13,auVar18);
        auVar13 = vmaxps_avx512f(auVar13,auVar2);
        auVar13 = vmaxps_avx512f(auVar13,auVar3);
        auVar13 = vmaxps_avx512f(auVar13,auVar4);
        auVar18 = vmaxps_avx512f(auVar5,auVar6);
        auVar13 = vmaxps_avx512f(auVar13,auVar7);
        auVar13 = vmaxps_avx512f(auVar13,auVar8);
        auVar13 = vmaxps_avx512f(auVar13,auVar18);
        local_4c0 = auVar13._0_8_;
        uStack_4b8 = auVar13._8_8_;
        uStack_4b0 = auVar13._16_8_;
        uStack_4a8 = auVar13._24_8_;
        uStack_4a0 = auVar13._32_8_;
        uStack_498 = auVar13._40_8_;
        uStack_490 = auVar13._48_8_;
        uStack_488 = auVar13._56_8_;
        local_23d8[8] = local_4c0;
        local_23d8[9] = uStack_4b8;
        local_23d8[10] = uStack_4b0;
        local_23d8[0xb] = uStack_4a8;
        local_23d8[0xc] = uStack_4a0;
        local_23d8[0xd] = uStack_498;
        local_23d8[0xe] = uStack_490;
        local_23d8[0xf] = uStack_488;
        local_2438 = local_2438 + 4;
        local_2440 = local_2440 + 4;
        local_2448 = local_2448 + 4;
        local_23d8 = local_23d8 + 0x10;
      }
      for (; local_2450 < iVar1; local_2450 = local_2450 + 1) {
        auVar13 = vmaxps_avx512f(*local_2438,local_2438[1]);
        auVar13 = vmaxps_avx512f(auVar13,local_2438[2]);
        auVar13 = vmaxps_avx512f(auVar13,*local_2440);
        auVar13 = vmaxps_avx512f(auVar13,local_2440[1]);
        auVar18 = vmaxps_avx512f(local_2440[2],*local_2448);
        auVar18 = vmaxps_avx512f(auVar18,local_2448[1]);
        auVar18 = vmaxps_avx512f(auVar18,local_2448[2]);
        auVar13 = vmaxps_avx512f(auVar13,auVar18);
        local_540 = auVar13._0_8_;
        uStack_538 = auVar13._8_8_;
        uStack_530 = auVar13._16_8_;
        uStack_528 = auVar13._24_8_;
        uStack_520 = auVar13._32_8_;
        uStack_518 = auVar13._40_8_;
        uStack_510 = auVar13._48_8_;
        uStack_508 = auVar13._56_8_;
        *local_23d8 = local_540;
        local_23d8[1] = uStack_538;
        local_23d8[2] = uStack_530;
        local_23d8[3] = uStack_528;
        local_23d8[4] = uStack_520;
        local_23d8[5] = uStack_518;
        local_23d8[6] = uStack_510;
        local_23d8[7] = uStack_508;
        local_2438 = local_2438 + 2;
        local_2440 = local_2440 + 2;
        local_2448 = local_2448 + 2;
        local_23d8 = local_23d8 + 8;
      }
      local_2438 = (undefined1 (*) [64])(*local_2438 + (long)iVar12 * 4);
      local_2440 = (undefined1 (*) [64])(*local_2440 + (long)iVar12 * 4);
      local_2448 = (undefined1 (*) [64])(*local_2448 + (long)iVar12 * 4);
    }
  }
  return;
}

Assistant:

static void pooling3x3s2_max_pack16_avx512(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = (w - 2 * outw + w) * 16;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);
        for (int i = 0; i < outh; i++)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m512 _r00 = _mm512_loadu_ps(r0);
                __m512 _r01 = _mm512_loadu_ps(r0 + 16);
                __m512 _r02 = _mm512_loadu_ps(r0 + 32);
                __m512 _r10 = _mm512_loadu_ps(r1);
                __m512 _r11 = _mm512_loadu_ps(r1 + 16);
                __m512 _r12 = _mm512_loadu_ps(r1 + 32);
                __m512 _r20 = _mm512_loadu_ps(r2);
                __m512 _r21 = _mm512_loadu_ps(r2 + 16);
                __m512 _r22 = _mm512_loadu_ps(r2 + 32);

                __m512 _max00 = _mm512_max_ps(_r00, _r01);
                _max00 = _mm512_max_ps(_max00, _r02);
                _max00 = _mm512_max_ps(_max00, _r10);
                _max00 = _mm512_max_ps(_max00, _r11);
                __m512 _max01 = _mm512_max_ps(_r12, _r20);
                _max01 = _mm512_max_ps(_max01, _r21);
                _max01 = _mm512_max_ps(_max01, _r22);

                __m512 _r03 = _mm512_loadu_ps(r0 + 48);
                __m512 _r04 = _mm512_loadu_ps(r0 + 64);
                __m512 _r13 = _mm512_loadu_ps(r1 + 48);
                __m512 _r14 = _mm512_loadu_ps(r1 + 64);
                __m512 _r23 = _mm512_loadu_ps(r2 + 48);
                __m512 _r24 = _mm512_loadu_ps(r2 + 64);

                _mm512_storeu_ps(outptr, _mm512_max_ps(_max00, _max01));

                __m512 _max10 = _mm512_max_ps(_r03, _r04);
                _max10 = _mm512_max_ps(_max10, _r02);
                _max10 = _mm512_max_ps(_max10, _r13);
                _max10 = _mm512_max_ps(_max10, _r14);
                __m512 _max11 = _mm512_max_ps(_r12, _r23);
                _max10 = _mm512_max_ps(_max10, _r24);
                _max10 = _mm512_max_ps(_max10, _r22);

                __m512 _r05 = _mm512_loadu_ps(r0 + 80);
                __m512 _r06 = _mm512_loadu_ps(r0 + 96);
                __m512 _r15 = _mm512_loadu_ps(r1 + 80);
                __m512 _r16 = _mm512_loadu_ps(r1 + 96);
                __m512 _r25 = _mm512_loadu_ps(r2 + 80);
                __m512 _r26 = _mm512_loadu_ps(r2 + 96);

                _mm512_storeu_ps(outptr + 16, _mm512_max_ps(_max10, _max11));

                __m512 _max20 = _mm512_max_ps(_r05, _r06);
                _max20 = _mm512_max_ps(_max20, _r04);
                _max20 = _mm512_max_ps(_max20, _r15);
                _max20 = _mm512_max_ps(_max20, _r16);
                __m512 _max21 = _mm512_max_ps(_r14, _r25);
                _max20 = _mm512_max_ps(_max20, _r26);
                _max20 = _mm512_max_ps(_max20, _r24);

                __m512 _r07 = _mm512_loadu_ps(r0 + 112);
                __m512 _r08 = _mm512_loadu_ps(r0 + 128);
                __m512 _r17 = _mm512_loadu_ps(r1 + 112);
                __m512 _r18 = _mm512_loadu_ps(r1 + 128);
                __m512 _r27 = _mm512_loadu_ps(r2 + 112);
                __m512 _r28 = _mm512_loadu_ps(r2 + 128);

                _mm512_storeu_ps(outptr + 32, _mm512_max_ps(_max20, _max21));

                __m512 _max30 = _mm512_max_ps(_r07, _r08);
                _max30 = _mm512_max_ps(_max30, _r06);
                _max30 = _mm512_max_ps(_max30, _r17);
                _max30 = _mm512_max_ps(_max30, _r18);
                __m512 _max31 = _mm512_max_ps(_r16, _r27);
                _max30 = _mm512_max_ps(_max30, _r28);
                _max30 = _mm512_max_ps(_max30, _r26);

                _mm512_storeu_ps(outptr + 48, _mm512_max_ps(_max30, _max31));

                r0 += 128;
                r1 += 128;
                r2 += 128;
                outptr += 64;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m512 _r00 = _mm512_loadu_ps(r0);
                __m512 _r01 = _mm512_loadu_ps(r0 + 16);
                __m512 _r02 = _mm512_loadu_ps(r0 + 32);
                __m512 _r10 = _mm512_loadu_ps(r1);
                __m512 _r11 = _mm512_loadu_ps(r1 + 16);
                __m512 _r12 = _mm512_loadu_ps(r1 + 32);
                __m512 _r20 = _mm512_loadu_ps(r2);
                __m512 _r21 = _mm512_loadu_ps(r2 + 16);
                __m512 _r22 = _mm512_loadu_ps(r2 + 32);

                __m512 _max00 = _mm512_max_ps(_r00, _r01);
                _max00 = _mm512_max_ps(_max00, _r02);
                _max00 = _mm512_max_ps(_max00, _r10);
                _max00 = _mm512_max_ps(_max00, _r11);
                __m512 _max01 = _mm512_max_ps(_r12, _r20);
                _max01 = _mm512_max_ps(_max01, _r21);
                _max01 = _mm512_max_ps(_max01, _r22);

                __m512 _r03 = _mm512_loadu_ps(r0 + 48);
                __m512 _r04 = _mm512_loadu_ps(r0 + 64);
                __m512 _r13 = _mm512_loadu_ps(r1 + 48);
                __m512 _r14 = _mm512_loadu_ps(r1 + 64);
                __m512 _r23 = _mm512_loadu_ps(r2 + 48);
                __m512 _r24 = _mm512_loadu_ps(r2 + 64);

                _mm512_storeu_ps(outptr, _mm512_max_ps(_max00, _max01));

                __m512 _max10 = _mm512_max_ps(_r03, _r04);
                _max10 = _mm512_max_ps(_max10, _r02);
                _max10 = _mm512_max_ps(_max10, _r13);
                _max10 = _mm512_max_ps(_max10, _r14);
                __m512 _max11 = _mm512_max_ps(_r12, _r23);
                _max10 = _mm512_max_ps(_max10, _r24);
                _max10 = _mm512_max_ps(_max10, _r22);

                _mm512_storeu_ps(outptr + 16, _mm512_max_ps(_max10, _max11));

                r0 += 64;
                r1 += 64;
                r2 += 64;
                outptr += 32;
            }

            for (; j < outw; j++)
            {
                __m512 _r00 = _mm512_loadu_ps(r0);
                __m512 _r01 = _mm512_loadu_ps(r0 + 16);
                __m512 _r02 = _mm512_loadu_ps(r0 + 32);
                __m512 _r10 = _mm512_loadu_ps(r1);
                __m512 _r11 = _mm512_loadu_ps(r1 + 16);
                __m512 _r12 = _mm512_loadu_ps(r1 + 32);
                __m512 _r20 = _mm512_loadu_ps(r2);
                __m512 _r21 = _mm512_loadu_ps(r2 + 16);
                __m512 _r22 = _mm512_loadu_ps(r2 + 32);

                __m512 _max0 = _mm512_max_ps(_r00, _r01);
                _max0 = _mm512_max_ps(_max0, _r02);
                _max0 = _mm512_max_ps(_max0, _r10);
                _max0 = _mm512_max_ps(_max0, _r11);
                __m512 _max1 = _mm512_max_ps(_r12, _r20);
                _max1 = _mm512_max_ps(_max1, _r21);
                _max1 = _mm512_max_ps(_max1, _r22);

                _mm512_storeu_ps(outptr, _mm512_max_ps(_max0, _max1));

                r0 += 32;
                r1 += 32;
                r2 += 32;
                outptr += 16;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}